

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

bool QtPrivate::QTypeNormalizer::starts_with_token(char *b,char *e,char *token,bool msvcKw)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  byte *pbVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  
  bVar6 = b == e;
  pcVar3 = token;
  pbVar4 = (byte *)b;
  if ((!bVar6) && (bVar5 = *token, bVar5 != 0)) {
    lVar1 = (long)e - (long)b;
    pcVar2 = token;
    do {
      pcVar3 = pcVar2;
      pbVar4 = (byte *)b;
      if (*b != bVar5) break;
      b = (char *)((byte *)b + 1);
      bVar6 = b == e;
      pcVar3 = token + lVar1;
      pbVar4 = (byte *)e;
      if (bVar6) break;
      bVar5 = pcVar2[1];
      pcVar3 = pcVar2 + 1;
      pcVar2 = pcVar3;
      pbVar4 = (byte *)b;
    } while (bVar5 != 0);
  }
  bVar7 = *pcVar3 == '\0';
  if ((!bVar6) && (*pcVar3 == '\0')) {
    bVar5 = *pbVar4;
    bVar7 = (bVar5 != 0x5f && (byte)(bVar5 - 0x3a) < 0xf6) && (byte)((bVar5 & 0xdf) + 0xa5) < 0xe6;
  }
  return bVar7;
}

Assistant:

static constexpr bool starts_with_token(const char *b, const char *e, const char *token,
                                            bool msvcKw = false)
    {
        while (b != e && *token && *b == *token) {
            b++;
            token++;
        }
        if (*token)
            return false;
#ifdef Q_CC_MSVC
        /// On MSVC, keywords like class or struct are not separated with spaces in constexpr
        /// context
        if (msvcKw && !is_ident_char(*b))
            return true;
#endif
        Q_UNUSED(msvcKw);
        return b == e || !is_ident_char(*b);
    }